

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall soplex::SPxLPBase<double>::clear(SPxLPBase<double> *this)

{
  long in_RDI;
  LPRowSetBase<double> *unaff_retaddr;
  
  LPRowSetBase<double>::clear(unaff_retaddr);
  LPColSetBase<double>::clear((LPColSetBase<double> *)unaff_retaddr);
  *(undefined4 *)(in_RDI + 400) = 1;
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined1 *)(in_RDI + 0x1a0) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  DataArray<int>::clear((DataArray<int> *)(in_RDI + 0x178));
  DataArray<int>::clear((DataArray<int> *)(in_RDI + 0xb0));
  return;
}

Assistant:

virtual void clear()
   {

      LPRowSetBase<R>::clear();
      LPColSetBase<R>::clear();
      thesense = MAXIMIZE;
      offset = 0;
      _isScaled = false;
      lp_scaler = nullptr;
      LPColSetBase<R>::scaleExp.clear();
      LPRowSetBase<R>::scaleExp.clear();
   }